

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::RemoveDefineFlag(cmMakefile *this,char *flag)

{
  size_type sVar1;
  bool bVar2;
  allocator local_41;
  string local_40;
  size_t local_20;
  size_type len;
  char *flag_local;
  cmMakefile *this_local;
  
  len = (size_type)flag;
  flag_local = (char *)this;
  local_20 = strlen(flag);
  if (local_20 != 0) {
    RemoveDefineFlag(this,(char *)len,local_20,&this->DefineFlagsOrig);
    sVar1 = len;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,(char *)sVar1,&local_41);
    bVar2 = ParseDefineFlag(this,&local_40,true);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (!bVar2) {
      RemoveDefineFlag(this,(char *)len,local_20,&this->DefineFlags);
    }
  }
  return;
}

Assistant:

void cmMakefile::RemoveDefineFlag(const char* flag)
{
  // Check the length of the flag to remove.
  std::string::size_type len = strlen(flag);
  if (len < 1) {
    return;
  }

  // Update the string used for the old DEFINITIONS property.
  this->RemoveDefineFlag(flag, len, this->DefineFlagsOrig);

  // If this is really a definition, update COMPILE_DEFINITIONS.
  if (this->ParseDefineFlag(flag, true)) {
    return;
  }

  // Remove this flag that does not look like a definition.
  this->RemoveDefineFlag(flag, len, this->DefineFlags);
}